

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O3

void icu_63::Transliterator::registerInstance(Transliterator *adoptedPrototype)

{
  UBool UVar1;
  UErrorCode ec;
  UErrorCode local_10 [2];
  
  umtx_lock_63(&registryMutex);
  local_10[0] = U_ZERO_ERROR;
  if ((registry != (TransliteratorRegistry *)0x0) ||
     (UVar1 = initializeRegistry(local_10), UVar1 != '\0')) {
    local_10[1] = 0;
    TransliteratorRegistry::put(registry,adoptedPrototype,'\x01',local_10 + 1);
  }
  umtx_unlock_63(&registryMutex);
  return;
}

Assistant:

void U_EXPORT2 Transliterator::registerInstance(Transliterator* adoptedPrototype) {
    Mutex lock(&registryMutex);
    UErrorCode ec = U_ZERO_ERROR;
    if (HAVE_REGISTRY(ec)) {
        _registerInstance(adoptedPrototype);
    }
}